

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O0

bool __thiscall
CPubKey::Verify(CPubKey *this,uint256 *hash,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig)

{
  bool bVar1;
  int iVar2;
  size_t in_RSI;
  secp256k1_ecdsa_signature *in_RDI;
  long in_FS_OFFSET;
  secp256k1_ecdsa_signature sig;
  secp256k1_pubkey pubkey;
  CPubKey *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  secp256k1_context *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  uchar *in_stack_ffffffffffffff88;
  secp256k1_pubkey *in_stack_ffffffffffffff90;
  secp256k1_context *in_stack_ffffffffffffff98;
  secp256k1_pubkey *in_stack_ffffffffffffffe0;
  uchar *in_stack_ffffffffffffffe8;
  secp256k1_ecdsa_signature *in_stack_fffffffffffffff0;
  secp256k1_context *ctx;
  
  ctx = *(secp256k1_context **)(in_FS_OFFSET + 0x28);
  bVar1 = IsValid(in_stack_ffffffffffffff28);
  if (bVar1) {
    size(in_stack_ffffffffffffff28);
    iVar2 = secp256k1_ec_pubkey_parse
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff80);
    if (iVar2 == 0) {
      bVar1 = false;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff28)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff28)
      ;
      iVar2 = ecdsa_signature_parse_der_lax
                        ((secp256k1_ecdsa_signature *)
                         CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_RDI->data,
                         in_RSI);
      if (iVar2 == 0) {
        bVar1 = false;
      }
      else {
        secp256k1_ecdsa_signature_normalize
                  (in_stack_ffffffffffffff78,
                   (secp256k1_ecdsa_signature *)
                   CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_RDI);
        base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffff28);
        iVar2 = secp256k1_ecdsa_verify
                          (ctx,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                           in_stack_ffffffffffffffe0);
        bVar1 = iVar2 != 0;
      }
    }
  }
  else {
    bVar1 = false;
  }
  if (*(secp256k1_context **)(in_FS_OFFSET + 0x28) == ctx) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CPubKey::Verify(const uint256 &hash, const std::vector<unsigned char>& vchSig) const {
    if (!IsValid())
        return false;
    secp256k1_pubkey pubkey;
    secp256k1_ecdsa_signature sig;
    if (!secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size())) {
        return false;
    }
    if (!ecdsa_signature_parse_der_lax(&sig, vchSig.data(), vchSig.size())) {
        return false;
    }
    /* libsecp256k1's ECDSA verification requires lower-S signatures, which have
     * not historically been enforced in Bitcoin, so normalize them first. */
    secp256k1_ecdsa_signature_normalize(secp256k1_context_static, &sig, &sig);
    return secp256k1_ecdsa_verify(secp256k1_context_static, &sig, hash.begin(), &pubkey);
}